

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-profile.c
# Opt level: O3

int luaopen_profile(lua_State *L)

{
  int idx;
  lua_CFunction p_Var1;
  long lVar2;
  undefined8 *puVar3;
  char *fmt;
  luaL_Reg *plVar4;
  byte bVar5;
  luaL_Reg l [5];
  luaL_Reg alStack_68 [5];
  
  bVar5 = 0;
  luaL_checkversion_(L,503.0,0x88);
  puVar3 = &DAT_00162cc0;
  plVar4 = alStack_68;
  for (lVar2 = 10; lVar2 != 0; lVar2 = lVar2 + -1) {
    plVar4->name = *puVar3;
    puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
    plVar4 = (luaL_Reg *)((long)plVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  lua_createtable(L,0,4);
  lua_createtable(L,0,0);
  lua_createtable(L,0,0);
  lua_createtable(L,0,0);
  lua_pushstring(L,"kv");
  lua_setfield(L,-2,"__mode");
  lua_pushvalue(L,-1);
  lua_setmetatable(L,-3);
  lua_setmetatable(L,-3);
  lua_pushnil(L);
  luaL_setfuncs(L,alStack_68,3);
  idx = lua_gettop(L);
  lua_getglobal(L,"coroutine");
  lua_getfield(L,-1,"resume");
  p_Var1 = lua_tocfunction(L,-1);
  if (p_Var1 == (lua_CFunction)0x0) {
    fmt = "Can\'t get coroutine.resume";
  }
  else {
    lua_settop(L,-2);
    lua_getfield(L,idx,"resume");
    lua_pushcclosure(L,p_Var1,0);
    lua_setupvalue(L,-2,3);
    lua_settop(L,-2);
    lua_getfield(L,-1,"yield");
    p_Var1 = lua_tocfunction(L,-1);
    if (p_Var1 != (lua_CFunction)0x0) {
      lua_settop(L,-2);
      lua_getfield(L,idx,"yield");
      lua_pushcclosure(L,p_Var1,0);
      lua_setupvalue(L,-2,3);
      lua_settop(L,idx);
      return 1;
    }
    fmt = "Can\'t get coroutine.yield";
  }
  luaL_error(L,fmt);
}

Assistant:

int
luaopen_profile(lua_State *L) {
	luaL_checkversion(L);
	luaL_Reg l[] = {
		{ "start", lstart },
		{ "stop", lstop },
		{ "resume", lresume },
		{ "yield", lyield },
		{ NULL, NULL },
	};
	luaL_newlibtable(L,l);
	lua_newtable(L);	// table thread->start time
	lua_newtable(L);	// table thread->total time

	lua_newtable(L);	// weak table
	lua_pushliteral(L, "kv");
	lua_setfield(L, -2, "__mode");

	lua_pushvalue(L, -1);
	lua_setmetatable(L, -3); 
	lua_setmetatable(L, -3);

	lua_pushnil(L);
	luaL_setfuncs(L,l,3);

	int libtable = lua_gettop(L);

	lua_getglobal(L, "coroutine");
	lua_getfield(L, -1, "resume");

	lua_CFunction co_resume = lua_tocfunction(L, -1);
	if (co_resume == NULL)
		return luaL_error(L, "Can't get coroutine.resume");
	lua_pop(L,1);
	lua_getfield(L, libtable, "resume");
	lua_pushcfunction(L, co_resume);
	lua_setupvalue(L, -2, 3);
	lua_pop(L,1);

	lua_getfield(L, -1, "yield");

	lua_CFunction co_yield = lua_tocfunction(L, -1);
	if (co_yield == NULL)
		return luaL_error(L, "Can't get coroutine.yield");
	lua_pop(L,1);
	lua_getfield(L, libtable, "yield");
	lua_pushcfunction(L, co_yield);
	lua_setupvalue(L, -2, 3);

	lua_settop(L, libtable);

	return 1;
}